

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::get_xdg_userdir_setting(Path *this,string *setting)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  runtime_error *prVar3;
  char *pcVar4;
  size_t sVar5;
  char *__modes;
  Path local_1378;
  undefined4 local_1358;
  allocator local_1353;
  undefined1 local_1352;
  allocator local_1351;
  string local_1350 [32];
  char *local_1330;
  char *homestr;
  char result [4096];
  allocator local_319;
  string local_318 [32];
  size_t local_2f8;
  size_t len;
  char *start;
  allocator local_2c1;
  string local_2c0 [8];
  string msg;
  char acStack_298 [7];
  bool found;
  char buf [256];
  char line [256];
  FILE *p_file;
  allocator local_79;
  string local_78 [32];
  Path local_58;
  undefined1 local_38 [8];
  Path userconfig;
  string *setting_local;
  
  userconfig._24_8_ = setting;
  config_dir();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"user-dirs.dirs",&local_79);
  join((Path *)local_38,&local_58,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ~Path(&local_58);
  bVar1 = is_file((Path *)local_38);
  if (bVar1) {
    __stream = fopen((Path *)local_38,"r",__modes);
    bVar1 = false;
    do {
      do {
        iVar2 = feof(__stream);
        if (iVar2 != 0) goto LAB_0011253a;
        buf[0xf8] = '\0';
        buf[0xf9] = '\0';
        buf[0xfa] = '\0';
        buf[0xfb] = '\0';
        buf[0xfc] = '\0';
        buf[0xfd] = '\0';
        buf[0xfe] = '\0';
        buf[0xff] = '\0';
        buf[0xe8] = '\0';
        buf[0xe9] = '\0';
        buf[0xea] = '\0';
        buf[0xeb] = '\0';
        buf[0xec] = '\0';
        buf[0xed] = '\0';
        buf[0xee] = '\0';
        buf[0xef] = '\0';
        buf[0xf0] = '\0';
        buf[0xf1] = '\0';
        buf[0xf2] = '\0';
        buf[0xf3] = '\0';
        buf[0xf4] = '\0';
        buf[0xf5] = '\0';
        buf[0xf6] = '\0';
        buf[0xf7] = '\0';
        buf[0xd8] = '\0';
        buf[0xd9] = '\0';
        buf[0xda] = '\0';
        buf[0xdb] = '\0';
        buf[0xdc] = '\0';
        buf[0xdd] = '\0';
        buf[0xde] = '\0';
        buf[0xdf] = '\0';
        buf[0xe0] = '\0';
        buf[0xe1] = '\0';
        buf[0xe2] = '\0';
        buf[0xe3] = '\0';
        buf[0xe4] = '\0';
        buf[0xe5] = '\0';
        buf[0xe6] = '\0';
        buf[0xe7] = '\0';
        buf[200] = '\0';
        buf[0xc9] = '\0';
        buf[0xca] = '\0';
        buf[0xcb] = '\0';
        buf[0xcc] = '\0';
        buf[0xcd] = '\0';
        buf[0xce] = '\0';
        buf[0xcf] = '\0';
        buf[0xd0] = '\0';
        buf[0xd1] = '\0';
        buf[0xd2] = '\0';
        buf[0xd3] = '\0';
        buf[0xd4] = '\0';
        buf[0xd5] = '\0';
        buf[0xd6] = '\0';
        buf[0xd7] = '\0';
        buf[0xb8] = '\0';
        buf[0xb9] = '\0';
        buf[0xba] = '\0';
        buf[0xbb] = '\0';
        buf[0xbc] = '\0';
        buf[0xbd] = '\0';
        buf[0xbe] = '\0';
        buf[0xbf] = '\0';
        buf[0xc0] = '\0';
        buf[0xc1] = '\0';
        buf[0xc2] = '\0';
        buf[0xc3] = '\0';
        buf[0xc4] = '\0';
        buf[0xc5] = '\0';
        buf[0xc6] = '\0';
        buf[199] = '\0';
        buf[0xa8] = '\0';
        buf[0xa9] = '\0';
        buf[0xaa] = '\0';
        buf[0xab] = '\0';
        buf[0xac] = '\0';
        buf[0xad] = '\0';
        buf[0xae] = '\0';
        buf[0xaf] = '\0';
        buf[0xb0] = '\0';
        buf[0xb1] = '\0';
        buf[0xb2] = '\0';
        buf[0xb3] = '\0';
        buf[0xb4] = '\0';
        buf[0xb5] = '\0';
        buf[0xb6] = '\0';
        buf[0xb7] = '\0';
        buf[0x98] = '\0';
        buf[0x99] = '\0';
        buf[0x9a] = '\0';
        buf[0x9b] = '\0';
        buf[0x9c] = '\0';
        buf[0x9d] = '\0';
        buf[0x9e] = '\0';
        buf[0x9f] = '\0';
        buf[0xa0] = '\0';
        buf[0xa1] = '\0';
        buf[0xa2] = '\0';
        buf[0xa3] = '\0';
        buf[0xa4] = '\0';
        buf[0xa5] = '\0';
        buf[0xa6] = '\0';
        buf[0xa7] = '\0';
        buf[0x88] = '\0';
        buf[0x89] = '\0';
        buf[0x8a] = '\0';
        buf[0x8b] = '\0';
        buf[0x8c] = '\0';
        buf[0x8d] = '\0';
        buf[0x8e] = '\0';
        buf[0x8f] = '\0';
        buf[0x90] = '\0';
        buf[0x91] = '\0';
        buf[0x92] = '\0';
        buf[0x93] = '\0';
        buf[0x94] = '\0';
        buf[0x95] = '\0';
        buf[0x96] = '\0';
        buf[0x97] = '\0';
        buf[0x78] = '\0';
        buf[0x79] = '\0';
        buf[0x7a] = '\0';
        buf[0x7b] = '\0';
        buf[0x7c] = '\0';
        buf[0x7d] = '\0';
        buf[0x7e] = '\0';
        buf[0x7f] = '\0';
        buf[0x80] = '\0';
        buf[0x81] = '\0';
        buf[0x82] = '\0';
        buf[0x83] = '\0';
        buf[0x84] = '\0';
        buf[0x85] = '\0';
        buf[0x86] = '\0';
        buf[0x87] = '\0';
        buf[0x68] = '\0';
        buf[0x69] = '\0';
        buf[0x6a] = '\0';
        buf[0x6b] = '\0';
        buf[0x6c] = '\0';
        buf[0x6d] = '\0';
        buf[0x6e] = '\0';
        buf[0x6f] = '\0';
        buf[0x70] = '\0';
        buf[0x71] = '\0';
        buf[0x72] = '\0';
        buf[0x73] = '\0';
        buf[0x74] = '\0';
        buf[0x75] = '\0';
        buf[0x76] = '\0';
        buf[0x77] = '\0';
        buf[0x58] = '\0';
        buf[0x59] = '\0';
        buf[0x5a] = '\0';
        buf[0x5b] = '\0';
        buf[0x5c] = '\0';
        buf[0x5d] = '\0';
        buf[0x5e] = '\0';
        buf[0x5f] = '\0';
        buf[0x60] = '\0';
        buf[0x61] = '\0';
        buf[0x62] = '\0';
        buf[99] = '\0';
        buf[100] = '\0';
        buf[0x65] = '\0';
        buf[0x66] = '\0';
        buf[0x67] = '\0';
        buf[0x48] = '\0';
        buf[0x49] = '\0';
        buf[0x4a] = '\0';
        buf[0x4b] = '\0';
        buf[0x4c] = '\0';
        buf[0x4d] = '\0';
        buf[0x4e] = '\0';
        buf[0x4f] = '\0';
        buf[0x50] = '\0';
        buf[0x51] = '\0';
        buf[0x52] = '\0';
        buf[0x53] = '\0';
        buf[0x54] = '\0';
        buf[0x55] = '\0';
        buf[0x56] = '\0';
        buf[0x57] = '\0';
        buf[0x38] = '\0';
        buf[0x39] = '\0';
        buf[0x3a] = '\0';
        buf[0x3b] = '\0';
        buf[0x3c] = '\0';
        buf[0x3d] = '\0';
        buf[0x3e] = '\0';
        buf[0x3f] = '\0';
        buf[0x40] = '\0';
        buf[0x41] = '\0';
        buf[0x42] = '\0';
        buf[0x43] = '\0';
        buf[0x44] = '\0';
        buf[0x45] = '\0';
        buf[0x46] = '\0';
        buf[0x47] = '\0';
        buf[0x28] = '\0';
        buf[0x29] = '\0';
        buf[0x2a] = '\0';
        buf[0x2b] = '\0';
        buf[0x2c] = '\0';
        buf[0x2d] = '\0';
        buf[0x2e] = '\0';
        buf[0x2f] = '\0';
        buf[0x30] = '\0';
        buf[0x31] = '\0';
        buf[0x32] = '\0';
        buf[0x33] = '\0';
        buf[0x34] = '\0';
        buf[0x35] = '\0';
        buf[0x36] = '\0';
        buf[0x37] = '\0';
        buf[0x18] = '\0';
        buf[0x19] = '\0';
        buf[0x1a] = '\0';
        buf[0x1b] = '\0';
        buf[0x1c] = '\0';
        buf[0x1d] = '\0';
        buf[0x1e] = '\0';
        buf[0x1f] = '\0';
        buf[0x20] = '\0';
        buf[0x21] = '\0';
        buf[0x22] = '\0';
        buf[0x23] = '\0';
        buf[0x24] = '\0';
        buf[0x25] = '\0';
        buf[0x26] = '\0';
        buf[0x27] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        _acStack_298 = 0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        fgets(buf + 0xf8,0x100,__stream);
      } while ((buf[0xf8] == '#') || (buf[0xf8] == '\n'));
      sVar5 = std::__cxx11::string::length();
      strncpy(acStack_298,buf + 0xfc,sVar5);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(acStack_298,pcVar4);
    } while (iVar2 != 0);
    bVar1 = true;
LAB_0011253a:
    fclose(__stream);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"Unknown XDG directory \'",&local_2c1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                     (char *)userconfig._24_8_);
      std::__cxx11::string::operator+=(local_2c0,(string *)&start);
      std::__cxx11::string::~string((string *)&start);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,local_2c0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar4 = strchr(buf + 0xf8,0x22);
    len = (size_t)(pcVar4 + 1);
    local_2f8 = strcspn((char *)len,"\"");
    if (len == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_318,"Malformed XDG config file (quote mismatch/missing quotes)!",&local_319);
      std::runtime_error::runtime_error(prVar3,local_318);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    memset(acStack_298,0,0x100);
    strncpy(acStack_298,(char *)len,local_2f8);
    memset(&homestr,0,0x1000);
    len = (size_t)strstr(acStack_298,"$HOME");
    if ((char *)len == (char *)0x0) {
      strcpy((char *)&homestr,acStack_298);
    }
    else {
      local_1330 = getenv("HOME");
      if (local_1330 == (char *)0x0) {
        local_1352 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1350,"$HOME not set!",&local_1351);
        std::runtime_error::runtime_error(prVar3,local_1350);
        local_1352 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      strncpy((char *)&homestr,acStack_298,len - (long)acStack_298);
      sVar5 = strlen((char *)&homestr);
      strcpy(result + (sVar5 - 8),local_1330);
      sVar5 = strlen((char *)&homestr);
      strcpy(result + (sVar5 - 8),(char *)(len + 5));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,(char *)&homestr,&local_1353);
    std::allocator<char>::~allocator((allocator<char> *)&local_1353);
  }
  else {
    home();
    str_abi_cxx11_(this);
    ~Path(&local_1378);
  }
  local_1358 = 1;
  ~Path((Path *)local_38);
  return this;
}

Assistant:

std::string Path::get_xdg_userdir_setting(const std::string& setting)
{
  // XDG user-dirs spec recommends (only) checking for $XDG_CONFIG_HOME/user-dirs.dirs,
  // the files under $XDG_CONFIG_DIRS are not to consider.
  Path userconfig = Path::config_dir().join("user-dirs.dirs");

  if (userconfig.is_file()) {
    FILE* p_file = userconfig.fopen("r");

    char line[256];
    char buf[256];
    bool found = false;
    while (!feof(p_file)) {
      memset(line, 0, 256);
      memset(buf, 0, 256);

      fgets(line, 256, p_file);

      // Ignore comments and empty lines
      if (line[0] == '#' || line[0] == '\n')
        continue;

      // Extract the setting name from the line, e.g. "DOWNLOAD" for
      // "XDG_DOWNLOAD_DIR=...".
      strncpy(buf, line + 4, setting.length()); // +4 for "XDG_"
      if (strcmp(buf, setting.c_str()) == 0) {
        found = true;
        break;
      }
    }

    fclose(p_file);

    // Error out if not found
    if (!found) {
      std::string msg = "Unknown XDG directory '";
      msg += setting + "' requested.";
      throw(std::runtime_error(msg));
    }

    // OK, we have found the correct setting. Extract the value now.
    // »XDG_DOWNLOAD_DIR="$HOME/Downloads"«
    char* start = strchr(line, '"') + 1; // Exclude " itself
    size_t len  = strcspn(start, "\"");

    if (!start) // Malformed
      throw(std::runtime_error("Malformed XDG config file (quote mismatch/missing quotes)!"));

    memset(buf, 0, 256);
    strncpy(buf, start, len);
    // buf now contains the part between the quotes followed by NUL bytes

    char result[PATH_MAX];
    memset(result, 0, PATH_MAX);

    // Replace $HOME with env value of $HOME
    start = strstr(buf, "$HOME");
    if (start) { // Contains $HOME
      char* homestr = getenv("HOME");
      if (!homestr)
        throw(std::runtime_error("$HOME not set!"));

      // Stuff before $HOME
      strncpy(result, buf, ((char*)start) - ((char*)buf)); // Compiler does not allow doing pointer arithmetics with char[], but with char* ??? They should be the same...
      // $HOME replacement
      strcpy(result + strlen(result), homestr);
      // Suff after $HOME ($HOME is exactly 5 chars long)
      strcpy(result + strlen(result), start + 5);
    }
    else { // No $HOME included. Copy everything verbosely.
      strcpy(result, buf);
    }

    // result now holds the final result with lots of NUL bytes at the end.
    return std::string(result);
  }

  // No XDG configuration on this system, use $HOME.
  return Path::home().str();
}